

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint update_adler32(uint adler,uchar *data,uint len)

{
  uint local_24;
  uint amount;
  uint s2;
  uint s1;
  uint len_local;
  uchar *data_local;
  uint adler_local;
  
  s1 = adler & 0xffff;
  s2 = adler >> 0x10;
  len_local = len;
  data_local = data;
  while (len_local != 0) {
    if (len_local < 0x15af) {
      local_24 = len_local;
    }
    else {
      local_24 = 0x15ae;
    }
    len_local = len_local - local_24;
    for (amount = local_24; amount != 0; amount = amount - 1) {
      s1 = *data_local + s1;
      s2 = s1 + s2;
      data_local = data_local + 1;
    }
    s1 = s1 % 0xfff1;
    s2 = s2 % 0xfff1;
  }
  return s2 << 0x10 | s1;
}

Assistant:

static unsigned update_adler32(unsigned adler, const unsigned char* data, unsigned len)
{
	unsigned s1 = adler & 0xffff;
	unsigned s2 = (adler >> 16) & 0xffff;

	while (len > 0)
	{
		/*at least 5550 sums can be done before the sums overflow, saving a lot of module divisions*/
		unsigned amount = len > 5550 ? 5550 : len;
		len -= amount;
		while (amount > 0)
		{
			s1 += (*data++);
			s2 += s1;
			--amount;
		}
		s1 %= 65521;
		s2 %= 65521;
	}

	return (s2 << 16) | s1;
}